

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::~UnitTestImpl(UnitTestImpl *this)

{
  pointer pTVar1;
  TestResult *in_RDI;
  ThreadLocal<testing::TestPartResultReporterInterface_*> *unaff_retaddr;
  TestResult *functor;
  
  (in_RDI->test_properites_mutex_).super_MutexBase.mutex_.__align =
       (long)&PTR__UnitTestImpl_001c3388;
  functor = in_RDI;
  ForEach<std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>,void(*)(testing::TestCase*)>
            ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)unaff_retaddr,
             (_func_void_TestCase_ptr *)in_RDI);
  ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
            ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
             unaff_retaddr,(_func_void_Environment_ptr *)functor);
  pTVar1 = in_RDI[3].test_part_results_.
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar1 != (pointer)0x0) {
    (**(code **)(*(long *)pTVar1 + 8))();
  }
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  ::~ThreadLocal((ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
                  *)unaff_retaddr);
  scoped_ptr<testing::internal::DeathTestFactory>::~scoped_ptr
            ((scoped_ptr<testing::internal::DeathTestFactory> *)0x177b02);
  scoped_ptr<testing::internal::InternalRunDeathTestFlag>::~scoped_ptr
            ((scoped_ptr<testing::internal::InternalRunDeathTestFlag> *)0x177b13);
  TestEventListeners::~TestEventListeners((TestEventListeners *)in_RDI);
  TestResult::~TestResult(in_RDI);
  ParameterizedTestCaseRegistry::~ParameterizedTestCaseRegistry
            ((ParameterizedTestCaseRegistry *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::~vector
            ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)unaff_retaddr);
  std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::~vector
            ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
             unaff_retaddr);
  ThreadLocal<testing::TestPartResultReporterInterface_*>::~ThreadLocal(unaff_retaddr);
  Mutex::~Mutex((Mutex *)unaff_retaddr);
  DefaultPerThreadTestPartResultReporter::~DefaultPerThreadTestPartResultReporter
            ((DefaultPerThreadTestPartResultReporter *)0x177ba6);
  DefaultGlobalTestPartResultReporter::~DefaultGlobalTestPartResultReporter
            ((DefaultGlobalTestPartResultReporter *)0x177bb4);
  FilePath::~FilePath((FilePath *)0x177bc2);
  return;
}

Assistant:

UnitTestImpl::~UnitTestImpl() {
  // Deletes every TestCase.
  ForEach(test_cases_, internal::Delete<TestCase>);

  // Deletes every Environment.
  ForEach(environments_, internal::Delete<Environment>);

  delete os_stack_trace_getter_;
}